

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GSPriorityFloodClass.cpp
# Opt level: O1

Boolean __thiscall GSFloodFill<unsigned_char>::Transform(GSFloodFill<unsigned_char> *this)

{
  _Rb_tree_header *p_Var1;
  iterator *piVar2;
  byte bVar3;
  size_t sVar4;
  _Elt_pointer ppVar5;
  iterator __position;
  uchar *puVar6;
  Boolean BVar7;
  byte bVar8;
  Boolean **ppBVar9;
  Boolean *pBVar10;
  ostream *poVar11;
  _Base_ptr p_Var12;
  int iVar13;
  uint uVar14;
  char *pcVar15;
  pointer ppVar16;
  long lVar17;
  long lVar18;
  deque<std::pair<int,int>,std::allocator<std::pair<int,int>>> *this_00;
  _Self __tmp;
  ulong uVar19;
  ulong uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  double dVar23;
  XY_t n;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> neighbors;
  pair<int,_int> local_a0;
  pair<double,_std::pair<int,_int>_> local_98;
  uint local_84;
  ulong local_80;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_78;
  deque<std::pair<int,int>,std::allocator<std::pair<int,int>>> *local_58;
  _Rb_tree<unsigned_char,std::pair<unsigned_char_const,std::pair<int,int>>,std::_Select1st<std::pair<unsigned_char_const,std::pair<int,int>>>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,std::pair<int,int>>>>
  *local_50;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_48;
  
  local_78.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pair<int,_int> *)0x0;
  local_78.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pair<int,_int> *)0x0;
  local_78.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar13 = this->rows;
  lVar17 = (long)iVar13;
  uVar20 = 0xffffffffffffffff;
  if (-1 < lVar17) {
    uVar20 = lVar17 * 8;
  }
  ppBVar9 = (Boolean **)operator_new__(uVar20);
  this->Closed = ppBVar9;
  if (0 < iVar13) {
    uVar14 = this->cols;
    lVar18 = 0;
    do {
      pBVar10 = (Boolean *)operator_new__((long)(int)uVar14);
      this->Closed[lVar18] = pBVar10;
      if (0 < (int)uVar14) {
        memset(this->Closed[lVar18],0,(ulong)uVar14);
      }
      lVar18 = lVar18 + 1;
    } while (lVar17 != lVar18);
  }
  if (iVar13 == 1) {
    local_98.first._4_4_ = 0;
    local_98.second.first = 0;
    local_98.first._0_1_ = **this->dem;
    std::
    _Rb_tree<unsigned_char,std::pair<unsigned_char_const,std::pair<int,int>>,std::_Select1st<std::pair<unsigned_char_const,std::pair<int,int>>>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,std::pair<int,int>>>>
    ::_M_emplace_equal<std::pair<unsigned_char,std::pair<int,int>>>
              ((_Rb_tree<unsigned_char,std::pair<unsigned_char_const,std::pair<int,int>>,std::_Select1st<std::pair<unsigned_char_const,std::pair<int,int>>>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,std::pair<int,int>>>>
                *)&this->Open,(pair<unsigned_char,_std::pair<int,_int>_> *)&local_98);
    **this->Closed = true;
    local_98.second.first = this->cols + -1;
    local_98.first._0_4_ = CONCAT31(local_98.first._1_3_,(*this->dem)[(long)this->cols + -1]);
    local_98.first._4_4_ = 0;
    std::
    _Rb_tree<unsigned_char,std::pair<unsigned_char_const,std::pair<int,int>>,std::_Select1st<std::pair<unsigned_char_const,std::pair<int,int>>>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,std::pair<int,int>>>>
    ::_M_emplace_equal<std::pair<unsigned_char,std::pair<int,int>>>
              ((_Rb_tree<unsigned_char,std::pair<unsigned_char_const,std::pair<int,int>>,std::_Select1st<std::pair<unsigned_char_const,std::pair<int,int>>>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,std::pair<int,int>>>>
                *)&this->Open,(pair<unsigned_char,_std::pair<int,_int>_> *)&local_98);
    (*this->Closed)[(long)this->cols + -1] = true;
  }
  else {
    if (0 < this->cols) {
      lVar18 = 0;
      lVar17 = 0;
      do {
        local_98.first._4_4_ = 0;
        local_98.second.first = (int)((ulong)lVar18 >> 0x20);
        local_98.first._0_1_ = (*this->dem)[lVar17];
        std::
        _Rb_tree<unsigned_char,std::pair<unsigned_char_const,std::pair<int,int>>,std::_Select1st<std::pair<unsigned_char_const,std::pair<int,int>>>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,std::pair<int,int>>>>
        ::_M_emplace_equal<std::pair<unsigned_char,std::pair<int,int>>>
                  ((_Rb_tree<unsigned_char,std::pair<unsigned_char_const,std::pair<int,int>>,std::_Select1st<std::pair<unsigned_char_const,std::pair<int,int>>>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,std::pair<int,int>>>>
                    *)&this->Open,(pair<unsigned_char,_std::pair<int,_int>_> *)&local_98);
        (*this->Closed)[lVar17] = true;
        local_98.first._0_4_ =
             CONCAT31(local_98.first._1_3_,this->dem[(long)this->rows + -1][lVar17]);
        local_98._4_8_ = (ulong)(this->rows - 1) + lVar18;
        std::
        _Rb_tree<unsigned_char,std::pair<unsigned_char_const,std::pair<int,int>>,std::_Select1st<std::pair<unsigned_char_const,std::pair<int,int>>>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,std::pair<int,int>>>>
        ::_M_emplace_equal<std::pair<unsigned_char,std::pair<int,int>>>
                  ((_Rb_tree<unsigned_char,std::pair<unsigned_char_const,std::pair<int,int>>,std::_Select1st<std::pair<unsigned_char_const,std::pair<int,int>>>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,std::pair<int,int>>>>
                    *)&this->Open,(pair<unsigned_char,_std::pair<int,_int>_> *)&local_98);
        this->Closed[(long)this->rows + -1][lVar17] = true;
        lVar17 = lVar17 + 1;
        lVar18 = lVar18 + 0x100000000;
      } while (lVar17 < this->cols);
    }
    if (2 < this->rows) {
      lVar17 = 1;
      do {
        local_98.first._4_4_ = (undefined4)lVar17;
        local_98.second.first = (int)((ulong)lVar17 >> 0x20);
        local_98.first._0_1_ = *this->dem[lVar17];
        std::
        _Rb_tree<unsigned_char,std::pair<unsigned_char_const,std::pair<int,int>>,std::_Select1st<std::pair<unsigned_char_const,std::pair<int,int>>>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,std::pair<int,int>>>>
        ::_M_emplace_equal<std::pair<unsigned_char,std::pair<int,int>>>
                  ((_Rb_tree<unsigned_char,std::pair<unsigned_char_const,std::pair<int,int>>,std::_Select1st<std::pair<unsigned_char_const,std::pair<int,int>>>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,std::pair<int,int>>>>
                    *)&this->Open,(pair<unsigned_char,_std::pair<int,_int>_> *)&local_98);
        *this->Closed[lVar17] = true;
        local_98.first._0_4_ =
             CONCAT31(local_98.first._1_3_,this->dem[lVar17][(long)this->cols + -1]);
        local_98._4_8_ = ((ulong)(this->cols - 1) << 0x20) + lVar17;
        std::
        _Rb_tree<unsigned_char,std::pair<unsigned_char_const,std::pair<int,int>>,std::_Select1st<std::pair<unsigned_char_const,std::pair<int,int>>>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,std::pair<int,int>>>>
        ::_M_emplace_equal<std::pair<unsigned_char,std::pair<int,int>>>
                  ((_Rb_tree<unsigned_char,std::pair<unsigned_char_const,std::pair<int,int>>,std::_Select1st<std::pair<unsigned_char_const,std::pair<int,int>>>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,std::pair<int,int>>>>
                    *)&this->Open,(pair<unsigned_char,_std::pair<int,_int>_> *)&local_98);
        this->Closed[lVar17][(long)this->cols + -1] = true;
        lVar17 = lVar17 + 1;
      } while (lVar17 < (long)this->rows + -1);
    }
  }
  if (this->verbose != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Number of edges: ",0x11);
    poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    p_Var12 = (this->Open)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->Open)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var12 != p_Var1) {
      iVar13 = 1;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Edge ",5);
        poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar13);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,": (",3);
        local_98.first._0_4_ = CONCAT31(local_98.first._1_3_,(char)p_Var12[1]._M_color);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)&local_98,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,") => (",6);
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,*(int *)&p_Var12[1].field_0x4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,", ",2);
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,*(int *)&p_Var12[1]._M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,")\n",2);
        p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
        iVar13 = iVar13 + 1;
      } while ((_Rb_tree_header *)p_Var12 != p_Var1);
    }
  }
  local_50 = (_Rb_tree<unsigned_char,std::pair<unsigned_char_const,std::pair<int,int>>,std::_Select1st<std::pair<unsigned_char_const,std::pair<int,int>>>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,std::pair<int,int>>>>
              *)&this->Open;
  local_58 = (deque<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&this->Pit;
  local_84 = 0;
  local_80 = 0;
  this_00 = local_58;
  lVar17 = local_98._4_8_;
LAB_001071c3:
  do {
    while( true ) {
      sVar4 = (this->Open)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      local_98._4_8_ = lVar17;
      if ((sVar4 == 0) &&
         ((this->Pit).c.
          super__Deque_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
          super__Deque_impl_data._M_finish._M_cur ==
          (this->Pit).c.
          super__Deque_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
          super__Deque_impl_data._M_start._M_cur)) {
        if (local_78.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pair<int,_int> *)0x0) {
          operator_delete(local_78.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_78.
                                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_78.
                                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        return true;
      }
      ppVar5 = (this->Pit).c.
               super__Deque_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
               .super__Deque_impl_data._M_start._M_cur;
      if ((this->Pit).c.
          super__Deque_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
          super__Deque_impl_data._M_finish._M_cur == ppVar5) {
        if (sVar4 != 0) {
          __position._M_node = (this->Open)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          local_84 = *(uint *)&__position._M_node[1].field_0x4;
          local_80 = (ulong)*(uint *)&__position._M_node[1]._M_parent;
          std::
          _Rb_tree<unsigned_char,std::pair<unsigned_char_const,std::pair<int,int>>,std::_Select1st<std::pair<unsigned_char_const,std::pair<int,int>>>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,std::pair<int,int>>>>
          ::erase_abi_cxx11_(local_50,__position);
        }
      }
      else {
        local_84 = ppVar5->first;
        local_80 = (ulong)(uint)ppVar5->second;
        std::deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::pop_front
                  ((deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)this_00);
      }
      if (this->verbose != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Processing cell (",0x11);
        poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_84);
        local_98.first._0_4_ = CONCAT31(local_98.first._1_3_,0x2c);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)&local_98,1);
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,(int)local_80);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"), elevation= ",0xe);
        poVar11 = std::ostream::_M_insert<double>((double)this->dem[(int)local_84][(int)local_80]);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
      }
      if (((((int)local_84 < 0) || (this->rows <= (int)local_84)) ||
          (uVar20 = local_80 << 0x20, (long)uVar20 < 0)) || (this->cols <= (int)local_80))
      goto LAB_00107457;
      if (this->verbose != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"\tCell is within the DEM.",0x18);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x80);
        std::ostream::put(-0x80);
        std::ostream::flush();
      }
      uVar19 = (ulong)local_84;
      BVar7 = neighborsOf(this,(XY_t)(uVar20 | uVar19),&local_78);
      if (!BVar7) break;
      if (this->verbose != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\tCell has ",10);
        poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11," neighbors.",0xb);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
      }
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
                (&local_48,&local_78);
      if (local_48.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          local_48.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        uVar20 = 0xffffffffffffffff;
      }
      else {
        uVar20 = 0xffffffff;
        uVar21 = 0;
        uVar22 = 0x406fe000;
        uVar14 = 0xffffffff;
        ppVar16 = local_48.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          dVar23 = (double)this->dem[ppVar16->first][ppVar16->second];
          if (dVar23 <= (double)CONCAT44(uVar22,uVar21) && (double)CONCAT44(uVar22,uVar21) != dVar23
             ) {
            uVar20 = (ulong)(uint)ppVar16->second;
            uVar14 = ppVar16->first;
          }
          if ((double)CONCAT44(uVar22,uVar21) <= dVar23) {
            dVar23 = (double)CONCAT44(uVar22,uVar21);
          }
          ppVar16 = ppVar16 + 1;
          uVar21 = SUB84(dVar23,0);
          uVar22 = (undefined4)((ulong)dVar23 >> 0x20);
        } while (ppVar16 !=
                 local_48.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
        uVar20 = (ulong)uVar14 | uVar20 << 0x20;
      }
      if (local_48.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_48.
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (this->verbose != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"\tNeighbor with minimal elevation is (",0x25);
        poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,(int)uVar20);
        local_98.first._0_1_ = 0x2c;
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)&local_98,1);
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,(int)(uVar20 >> 0x20));
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"), whose elevation is ",0x16);
        local_98.first._0_4_ =
             CONCAT31(local_98.first._1_3_,this->dem[(int)uVar20][(long)uVar20 >> 0x20]);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)&local_98,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,".",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
      }
      lVar17 = local_98._4_8_;
      if (this->verbose != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"\tFor all neighbors, do:",0x17);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x80);
        std::ostream::put(-0x80);
        std::ostream::flush();
        lVar17 = local_98._4_8_;
      }
      local_98.second.first = (int)((ulong)lVar17 >> 0x20);
      local_98.first._4_4_ = (undefined4)lVar17;
      dVar23 = (double)CONCAT44(local_98.first._4_4_,local_98.first._0_4_);
      if (local_78.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_78.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        lVar18 = (long)(int)local_80;
        ppVar16 = local_78.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          local_a0 = *ppVar16;
          local_98.first = dVar23;
          if (this->Closed[local_a0.first][(long)local_a0 >> 0x20] == true) {
            if (this->verbose != 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"\t\tNeighbor (",0xc);
              poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_a0.first);
              local_98.first._0_4_ = CONCAT31(local_98.first._1_3_,0x2c);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar11,(char *)&local_98,1);
              poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_a0.second);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,") has been already ",0x13)
              ;
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,"encountered -- ignoring it.",0x1b);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
              std::ostream::put((char)poVar11);
              std::ostream::flush();
              dVar23 = (double)CONCAT44(local_98.first._4_4_,local_98.first._0_4_);
            }
          }
          else {
            if (this->verbose != 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"\t\tProcessing neighbor (",0x17);
              poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_a0.first);
              local_98.first._0_1_ = 0x2c;
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar11,(char *)&local_98,1);
              poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_a0.second);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,"):",2);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
              std::ostream::put((char)poVar11);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         "\t\t\tCalculating max(current neighbor, popped cell), i.e. max(dem[",0x40)
              ;
              poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_a0.first);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,"][",2);
              poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_a0.second);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,"], dem[",7);
              poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_84);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,"][",2);
              poVar11 = (ostream *)std::ostream::operator<<(poVar11,(int)local_80);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,"]) = ",5);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,"max(",4);
              local_98.first._0_1_ = this->dem[local_a0.first][local_a0.second];
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar11,(char *)&local_98,1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,", ",2);
              local_98.first._0_1_ = this->dem[uVar19][lVar18];
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar11,(char *)&local_98,1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,") = ",4);
              bVar3 = this->dem[local_a0.first][local_a0.second];
              local_98.first._0_1_ = this->dem[uVar19][lVar18];
              if (local_98.first._0_1_ < bVar3) {
                local_98.first._0_1_ = bVar3;
              }
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar11,(char *)&local_98,1);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
              std::ostream::put((char)poVar11);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"\t\t\tElevating cell (",0x13);
              poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_a0.first);
              local_98.first._0_1_ = 0x2c;
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar11,(char *)&local_98,1);
              poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_a0.second);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,") from ",7);
              local_98.first._0_1_ = this->dem[local_a0.first][local_a0.second];
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar11,(char *)&local_98,1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11," to ",4);
              bVar3 = this->dem[local_a0.first][local_a0.second];
              bVar8 = this->dem[uVar19][lVar18];
              if (bVar8 < bVar3) {
                bVar8 = bVar3;
              }
              local_98.first._0_4_ = CONCAT31(local_98.first._1_3_,bVar8);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar11,(char *)&local_98,1);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
              std::ostream::put((char)poVar11);
              std::ostream::flush();
              dVar23 = (double)CONCAT44(local_98.first._4_4_,local_98.first._0_4_);
            }
            lVar17 = (long)local_a0.second;
            this->Closed[local_a0.first][lVar17] = true;
            puVar6 = this->dem[local_a0.first];
            bVar3 = this->dem[uVar19][lVar18];
            local_98.first = dVar23;
            if (bVar3 < puVar6[lVar17]) {
              if (this->verbose != 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"\t\t\tPush cell (",0xe);
                poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_a0.first);
                local_98.first._0_1_ = 0x2c;
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar11,(char *)&local_98,1);
                poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_a0.second);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,") onto stack Open with priority ",0x20);
                local_98.first._0_4_ =
                     CONCAT31(local_98.first._1_3_,this->dem[local_a0.first][local_a0.second]);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar11,(char *)&local_98,1);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
                std::ostream::put((char)poVar11);
                std::ostream::flush();
              }
              local_98.first = (double)this->dem[ppVar16->first][ppVar16->second];
              local_98.second.first = (*ppVar16).first;
              local_98.second.second = (*ppVar16).second;
              std::
              _Rb_tree<unsigned_char,std::pair<unsigned_char_const,std::pair<int,int>>,std::_Select1st<std::pair<unsigned_char_const,std::pair<int,int>>>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,std::pair<int,int>>>>
              ::_M_emplace_equal<std::pair<double,std::pair<int,int>>>(local_50,&local_98);
              dVar23 = local_98.first;
            }
            else {
              puVar6[lVar17] = bVar3;
              if (this->verbose != 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"\t\t\tPush cell (",0xe);
                poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_a0.first);
                local_98.first._0_4_ = CONCAT31(local_98.first._1_3_,0x2c);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar11,(char *)&local_98,1);
                poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_a0.second);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,") onto queue Pit",0x10);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
                std::ostream::put((char)poVar11);
                std::ostream::flush();
                dVar23 = (double)CONCAT44(local_98.first._4_4_,local_98.first._0_4_);
              }
              ppVar5 = (this->Pit).c.
                       super__Deque_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_cur;
              if (ppVar5 == (this->Pit).c.
                            super__Deque_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                local_98.first = dVar23;
                std::deque<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
                _M_push_back_aux<std::pair<int,int>const&>(local_58,&local_a0);
                dVar23 = local_98.first;
              }
              else {
                *ppVar5 = local_a0;
                piVar2 = &(this->Pit).c.
                          super__Deque_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish;
                piVar2->_M_cur = piVar2->_M_cur + 1;
              }
            }
          }
          local_98.first._4_4_ = (undefined4)((ulong)dVar23 >> 0x20);
          local_98.first._0_4_ = SUB84(dVar23,0);
          lVar17 = CONCAT44(local_98.second.first,local_98.first._4_4_);
          ppVar16 = ppVar16 + 1;
          this_00 = local_58;
        } while (ppVar16 !=
                 local_78.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      }
    }
    lVar18 = 0x17;
    pcVar15 = "\tCell has no neighbors.";
    lVar17 = local_98._4_8_;
  } while (this->verbose == 0);
  goto LAB_0010746c;
LAB_00107457:
  lVar18 = 0x30;
  pcVar15 = "\tIgnoring the cell, as it is not within the DEM.";
  lVar17 = local_98._4_8_;
  if (this->verbose != 0) {
LAB_0010746c:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar15,lVar18);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x80);
    std::ostream::put(-0x80);
    std::ostream::flush();
    lVar17 = local_98._4_8_;
  }
  goto LAB_001071c3;
}

Assistant:

Boolean GSFloodFill<T>::Transform() {
	int i, j;
	XY_t xy, c;
	PrIterator_t it;
	vector<XY_t> neighbors;

	 /////////////// 
	// Algorithm 2 //
	 ///////////////

	// Let Closed have the same dimensions as DEM
	// Let Closed be initialized to false
	Closed = new Boolean* [rows];
	for (i=0; i<rows; i++) {
		Closed[i] = new Boolean [cols];
		for (j=0; j<cols; j++) {
			Closed[i][j] = false;
		}
	}

	if (rows == 1) { // monodimensional case
		xy = pair<int,int>(0, 0);
		Open.insert(pair<T,XY_t>(dem[0][0], xy));
		Closed[0][0] = true;
		xy = pair<int,int>(0, cols-1);
		Open.insert(pair<T,XY_t>(dem[0][cols-1], xy));
		Closed[0][cols-1] = true;
	} else {		// bidimensional case
		// for all edges of DEM do
		for (j=0; j<cols; j++) {
			xy = pair<int,int>(0, j);
			Open.insert(pair<T,XY_t>(dem[0][j], xy));
			Closed[0][j] = true;
			xy = pair<int,int>(rows-1, j);
			Open.insert(pair<T,XY_t>(dem[rows-1][j], xy));
			Closed[rows-1][j] = true;
		}
		for (i=1; i<rows-1; i++) {
			xy = pair<int,int>(i, 0);
			Open.insert(pair<T,XY_t>(dem[i][0], xy));
			Closed[i][0] = true;
			xy = pair<int,int>(i,cols-1);
			Open.insert(pair<T,XY_t>(dem[i][cols-1], xy));
			Closed[i][cols-1] = true;
		}
	}

	if (verbose) {
		std::cout << "Number of edges: " << Open.size() << std::endl;
		for (it=Open.begin(), i=1; it != Open.end(); it++, i++)
				std::cout << "Edge " << i << ": (" << it->first << ") => (" << it->second.first
					<< ", " << it->second.second << ")\n";
	}



	// while either Open or Pit is not empty do
	while ( ! Open.empty() || ! Pit.empty() ) {
		if ( ! Pit.empty() ) {
			c=Pit.front();
			Pit.pop();
		} else {
			PrioPop(Open,c);
		}

		// An edge was found on either Open or Pit
		if (verbose)
			std::cerr << "Processing cell (" << c.first << ',' << c.second << "), elevation= " << (Real) dem[c.first][c.second]  << std::endl;
		
		if (! isWithin(c)) {
			if (verbose)
				std::cerr << "\tIgnoring the cell, as it is not within the DEM." << std::endl;
			continue;
		}

		// The edge is within the DEM
		if (verbose)
			std::cerr << "\tCell is within the DEM." << std::endl;

		// neighbors lists the neighbors of c
		if (! neighborsOf(c, neighbors)) {
			if (verbose)
				std::cerr << "\tCell has no neighbors." << std::endl;
			continue;
		}
		// Here, neighbors contains the neighbors of c
		if (verbose)
			std::cerr << "\tCell has " << neighbors.size() << " neighbors." << std::endl;
		

		// miNeighbor is the coordinates of the cell with minimal elevation
		XY_t miNeighbor = miNeighbors(neighbors);
		if (verbose)
			std::cerr << "\tNeighbor with minimal elevation is (" << miNeighbor.first << ',' << miNeighbor.second
				 << "), whose elevation is " << dem[miNeighbor.first][miNeighbor.second] << "." << std::endl;

		
		if (verbose)
			std::cerr << "\tFor all neighbors, do:" << std::endl;



		for (vector<XY_t>::iterator nit = neighbors.begin(); nit != neighbors.end(); nit++) {
			XY_t n = *nit;

			if (isClosed(n)) {
				if (verbose)
					std::cerr << "\t\tNeighbor (" << n.first << ',' << n.second << ") has been already "
					<< "encountered -- ignoring it." << std::endl;

				continue;
			}

			if (verbose) {
				std::cerr << "\t\tProcessing neighbor (" << n.first << ',' << n.second << "):" << std::endl;

				std::cerr << "\t\t\tCalculating max(current neighbor, popped cell), i.e. max(dem[" 
					<< n.first << "][" << n.second << "], dem[" << c.first << "][" << c.second << "]) = "
					<< "max(" << dem[n.first][n.second] << ", " << dem[c.first][c.second] << ") = "
					<< std::max(dem[n.first][n.second], dem[c.first][c.second]) << std::endl;

				std::cerr << "\t\t\tElevating cell (" << n.first << ',' << n.second << ") from " << dem[n.first][n.second]
					<< " to " << std::max(dem[n.first][n.second], dem[c.first][c.second]) << std::endl;
			}

			Closed[n.first][n.second] = true;

			if (dem[n.first][n.second] <= dem[c.first][c.second]) {
				dem[n.first][n.second] = dem[c.first][c.second];

				if (verbose)
					std::cerr << "\t\t\tPush cell (" << n.first << ',' << n.second << ") onto queue Pit" << std::endl;

				Pit.push(n);
			} else {
				if (verbose)
					std::cerr << "\t\t\tPush cell (" << n.first << ',' << n.second << ") onto stack Open with priority "
						<< dem[n.first][n.second] << std::endl;

				// Push n onto Open with priority DEM(n)
				Open.insert(pair<Real,XY_t>(dem[nit->first][nit->second], *nit));
			}
		}
	}

	return true;
}